

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckApplet(TidyDocImpl *doc,Node *node)

{
  long lVar1;
  uint uVar2;
  Lexer *pLVar3;
  bool bVar4;
  Bool BVar5;
  AttVal *pAVar6;
  Node *pNVar7;
  ulong uVar8;
  ctmbstr cp;
  tmbchar *ptVar9;
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    pAVar6 = node->attributes;
    if (pAVar6 != (AttVal *)0x0) {
      bVar4 = false;
      do {
        if (((pAVar6->dict != (Attribute *)0x0) && (pAVar6->dict->id == TidyAttr_ALT)) &&
           (pAVar6->value != (tmbstr)0x0)) {
          bVar4 = true;
        }
        pAVar6 = pAVar6->next;
      } while (pAVar6 != (AttVal *)0x0);
      if (bVar4) {
        return;
      }
    }
    pNVar7 = node->content;
    if (pNVar7 == (Node *)0x0) {
LAB_00154380:
      prvTidyReportAccessError(doc,node,0x29d);
      return;
    }
    if (pNVar7->tag == (Dict *)0x0) {
      ptVar9 = (doc->access).text;
      uVar2 = pNVar7->start;
      if (uVar2 < pNVar7->end) {
        pLVar3 = doc->lexer;
        uVar8 = 0;
        do {
          ptVar9[uVar8] = pLVar3->lexbuf[uVar8 + uVar2];
          if (uVar8 == 0x7f) {
            uVar8 = 0x7f;
            break;
          }
          lVar1 = uVar2 + uVar8;
          uVar8 = uVar8 + 1;
        } while (lVar1 + 1U < (ulong)pNVar7->end);
        uVar8 = uVar8 & 0xffffffff;
      }
      else {
        uVar8 = 0;
      }
      ptVar9[uVar8] = '\0';
      pNVar7 = node->content;
    }
    else {
      ptVar9 = (tmbchar *)0x0;
    }
    pNVar7 = pNVar7->content;
    if ((pNVar7 == (Node *)0x0) || (pNVar7->tag != (Dict *)0x0)) {
      if (ptVar9 == (tmbchar *)0x0) goto LAB_00154380;
    }
    else {
      ptVar9 = (doc->access).text;
      uVar2 = pNVar7->start;
      if (uVar2 < pNVar7->end) {
        pLVar3 = doc->lexer;
        uVar8 = 0;
        do {
          ptVar9[uVar8] = pLVar3->lexbuf[uVar8 + uVar2];
          if (uVar8 == 0x7f) {
            uVar8 = 0x7f;
            break;
          }
          lVar1 = uVar2 + uVar8;
          uVar8 = uVar8 + 1;
        } while (lVar1 + 1U < (ulong)pNVar7->end);
        uVar8 = uVar8 & 0xffffffff;
      }
      else {
        uVar8 = 0;
      }
      ptVar9[uVar8] = '\0';
    }
    do {
      if (*ptVar9 == '\0') goto LAB_00154380;
      BVar5 = prvTidyIsWhite((int)*ptVar9);
      ptVar9 = ptVar9 + 1;
    } while (BVar5 != no);
  }
  return;
}

Assistant:

static void CheckApplet( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasDescription = no;

    AttVal* av;
        
    if (Level1_Enabled( doc ))
    {
        /* Checks for attributes within the APPLET element */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /*
               Checks for valid ALT attribute.
               The length of the alt text must be > 4 characters in length
               but must be < 150 characters long.
            */

            if ( attrIsALT(av) )
            {
                if (av->value != NULL)
                {
                    HasAlt = yes;
                }
            }
        }

        if (HasAlt == no)
        {
            /* Must have alternate text representation for that element */
            if (node->content != NULL) 
            {
                ctmbstr word = NULL;

                if ( node->content->tag == NULL )
                    word = textFromOneNode( doc, node->content);

                if ( node->content->content != NULL &&
                     node->content->content->tag == NULL )
                {
                    word = textFromOneNode( doc, node->content->content);
                }
                
                if ( word != NULL && !IsWhitespace(word) )
                    HasDescription = yes;
            }
        }

        if ( !HasDescription && !HasAlt )
        {
            TY_(ReportAccessError)( doc, node, APPLET_MISSING_ALT );
        }
    }
}